

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor::InternalSwap
          (BayesianProbitRegressor *this,BayesianProbitRegressor *other)

{
  BayesianProbitRegressor *other_local;
  BayesianProbitRegressor *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->features_).super_RepeatedPtrFieldBase,
             &(other->features_).super_RepeatedPtrFieldBase);
  std::swap<std::__cxx11::string*>
            (&(this->regressioninputfeaturename_).ptr_,&(other->regressioninputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->optimisminputfeaturename_).ptr_,&(other->optimisminputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->samplingscaleinputfeaturename_).ptr_,
             &(other->samplingscaleinputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->samplingtruncationinputfeaturename_).ptr_,
             &(other->samplingtruncationinputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->meanoutputfeaturename_).ptr_,&(other->meanoutputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->varianceoutputfeaturename_).ptr_,&(other->varianceoutputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->pessimisticprobabilityoutputfeaturename_).ptr_,
             &(other->pessimisticprobabilityoutputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->sampledprobabilityoutputfeaturename_).ptr_,
             &(other->sampledprobabilityoutputfeaturename_).ptr_);
  std::swap<CoreML::Specification::BayesianProbitRegressor_Gaussian*>(&this->bias_,&other->bias_);
  std::swap<unsigned_int>(&this->numberoffeatures_,&other->numberoffeatures_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void BayesianProbitRegressor::InternalSwap(BayesianProbitRegressor* other) {
  features_.InternalSwap(&other->features_);
  regressioninputfeaturename_.Swap(&other->regressioninputfeaturename_);
  optimisminputfeaturename_.Swap(&other->optimisminputfeaturename_);
  samplingscaleinputfeaturename_.Swap(&other->samplingscaleinputfeaturename_);
  samplingtruncationinputfeaturename_.Swap(&other->samplingtruncationinputfeaturename_);
  meanoutputfeaturename_.Swap(&other->meanoutputfeaturename_);
  varianceoutputfeaturename_.Swap(&other->varianceoutputfeaturename_);
  pessimisticprobabilityoutputfeaturename_.Swap(&other->pessimisticprobabilityoutputfeaturename_);
  sampledprobabilityoutputfeaturename_.Swap(&other->sampledprobabilityoutputfeaturename_);
  std::swap(bias_, other->bias_);
  std::swap(numberoffeatures_, other->numberoffeatures_);
  std::swap(_cached_size_, other->_cached_size_);
}